

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

byte __thiscall nuraft::buffer::get_byte(buffer *this)

{
  buffer bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  overflow_error *this_00;
  uint uVar5;
  
  uVar2 = *(uint *)this;
  if ((int)uVar2 < 0) {
    uVar4 = uVar2 & 0x7fffffff;
    uVar5 = *(uint *)(this + 4);
  }
  else {
    uVar4 = (uint)*(ushort *)this;
    uVar5 = (uint)*(ushort *)(this + 2);
  }
  if (uVar4 == uVar5) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer available for a byte");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  if ((int)uVar2 < 0) {
    lVar3 = (ulong)*(uint *)(this + 4) + 8;
  }
  else {
    lVar3 = (ulong)*(ushort *)(this + 2) + 4;
  }
  bVar1 = this[lVar3];
  if ((int)uVar2 < 0) {
    *(int *)(this + 4) = *(int *)(this + 4) + 1;
  }
  else {
    *(short *)(this + 2) = *(short *)(this + 2) + 1;
  }
  return (byte)bVar1;
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}